

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O2

error_code __thiscall
anon_unknown.dwarf_47bdd1::_remove_all_r
          (anon_unknown_dwarf_47bdd1 *this,StringRef path,file_type ft,uint32_t *count)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  error_category *peVar4;
  int *piVar5;
  error_category *peVar6;
  undefined4 in_register_0000000c;
  int *piVar7;
  error_category *extraout_RDX;
  error_category *extraout_RDX_00;
  uint uVar8;
  StringRef SVar9;
  error_code eVar10;
  ulong uStack_1f0;
  error_code ec;
  StringRef path_local;
  error_code ec_1;
  directory_iterator i;
  error_condition local_198;
  directory_iterator e;
  SmallString<128U> PathStorage;
  Twine local_d8;
  stat local_c0;
  
  piVar7 = (int *)CONCAT44(in_register_0000000c,ft);
  path_local.Length = (size_t)path.Data;
  path_local.Data = (char *)this;
  if ((int)path.Length == 3) {
    ec._M_value = 0;
    peVar4 = (error_category *)std::_V2::system_category();
    ec._M_cat = peVar4;
    llvm::Twine::Twine((Twine *)&PathStorage,&path_local);
    llvm::sys::fs::directory_iterator::directory_iterator(&i,(Twine *)&PathStorage,&ec,false);
    if (ec._M_value == 0) {
      e.State.super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      e.State.super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      e.FollowSymlinks = true;
      while (bVar1 = llvm::sys::fs::directory_iterator::operator!=(&i,&e), bVar1) {
        peVar6 = ec._M_cat;
        uVar8 = ec._M_value;
        if (ec._M_value != 0) {
LAB_001b323e:
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&e.State.
                      super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          bVar1 = false;
          goto LAB_001b324f;
        }
        llvm::Twine::Twine(&local_d8,
                           &((i.State.
                              super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->CurrentEntry).Path);
        PathStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
        super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
        super_SmallVectorBase.BeginX =
             &PathStorage.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>;
        PathStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
        super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
        super_SmallVectorBase.Size = 0;
        PathStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
        super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
        super_SmallVectorBase.Capacity = 0x80;
        SVar9 = llvm::Twine::toNullTerminatedStringRef
                          (&local_d8,(SmallVectorImpl<char> *)&PathStorage);
        iVar2 = llbuild::basic::sys::lstat(SVar9.Data,&local_c0);
        if (iVar2 == 0) {
          uStack_1f0 = (ulong)((local_c0.st_mode & 0xf000) - 0x1000 >> 0xc);
          uVar8 = 0;
          switch(uStack_1f0) {
          case 0:
            uStack_1f0 = 7;
            peVar6 = peVar4;
            break;
          case 1:
            uStack_1f0 = 6;
            peVar6 = peVar4;
            break;
          default:
            uStack_1f0 = 9;
            peVar6 = peVar4;
            break;
          case 3:
          case 5:
            peVar6 = peVar4;
            break;
          case 7:
            uStack_1f0 = 2;
            peVar6 = peVar4;
            break;
          case 9:
            uStack_1f0 = 4;
            peVar6 = peVar4;
            break;
          case 0xb:
            uStack_1f0 = 8;
            peVar6 = peVar4;
          }
        }
        else {
          piVar5 = __errno_location();
          iVar2 = *piVar5;
          ec_1._M_cat = (error_category *)std::_V2::generic_category();
          local_198._M_value = 2;
          ec_1._M_value = iVar2;
          local_198._M_cat = ec_1._M_cat;
          bVar1 = std::operator==(&ec_1,&local_198);
          uStack_1f0 = (ulong)bVar1;
          peVar6 = ec_1._M_cat;
          uVar8 = ec_1._M_value;
        }
        llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&PathStorage);
        if (uVar8 != 0) goto LAB_001b323e;
        SVar9.Length = uStack_1f0;
        SVar9.Data = (char *)((i.State.
                               super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->CurrentEntry).Path._M_string_length;
        eVar10 = _remove_all_r((anon_unknown_dwarf_47bdd1 *)
                               ((i.State.
                                 super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->CurrentEntry).Path._M_dataplus._M_p,SVar9,ft,count);
        peVar6 = eVar10._M_cat;
        uVar8 = eVar10._M_value;
        if (uVar8 != 0) goto LAB_001b323e;
        llvm::sys::fs::directory_iterator::increment(&i,&ec);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&e.State.
                  super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      llvm::Twine::Twine((Twine *)&PathStorage,&path_local);
      uVar8 = 0;
      uVar3 = llvm::sys::fs::remove((fs *)&PathStorage,(char *)0x0);
      peVar6 = extraout_RDX_00;
      if (uVar3 == 0) {
        *piVar7 = *piVar7 + 1;
        bVar1 = true;
      }
      else {
        bVar1 = false;
        uVar8 = uVar3;
      }
    }
    else {
      bVar1 = false;
      peVar6 = ec._M_cat;
      uVar8 = ec._M_value;
    }
LAB_001b324f:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&i.State.
                super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (bVar1) {
      peVar6 = peVar4;
      uVar8 = 0;
    }
  }
  else {
    llvm::Twine::Twine((Twine *)&PathStorage,&path_local);
    uVar8 = llvm::sys::fs::remove((fs *)&PathStorage,(char *)0x0);
    peVar6 = extraout_RDX;
    if (uVar8 == 0) {
      *piVar7 = *piVar7 + 1;
      peVar6 = (error_category *)std::_V2::system_category();
      uVar8 = 0;
    }
  }
  eVar10._4_4_ = 0;
  eVar10._M_value = uVar8;
  eVar10._M_cat = peVar6;
  return eVar10;
}

Assistant:

error_code _remove_all_r(StringRef path, file_type ft, uint32_t &count) {
    if (ft == file_type::directory_file) {
      error_code ec;
      // For removal purposes, we should not follow through symlinks. Rather,
      // we just want to remove the symlink itself.
      directory_iterator i(path, ec, /* FollowSymlinks */ false);
      if (ec)
        return ec;

      for (directory_iterator e; i != e; i.increment(ec)) {
        if (ec)
          return ec;

        file_status st;

        if (error_code ec = link_status(i->path(), st))
          return ec;

        if (error_code ec = _remove_all_r(i->path(), st.type(), count))
          return ec;
      }

      if (error_code ec = remove(path, false))
        return ec;

      ++count; // Include the directory itself in the items removed.
    } else {
      if (error_code ec = remove(path, false))
        return ec;

      ++count;
    }

    return error_code();
  }